

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTextHtmlParser::ExternalStyleSheet>::moveAppend
          (QGenericArrayOps<QTextHtmlParser::ExternalStyleSheet> *this,ExternalStyleSheet *b,
          ExternalStyleSheet *e)

{
  ExternalStyleSheet *pEVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  StyleRule *pSVar6;
  Data *pDVar7;
  MediaRule *pMVar8;
  Data *pDVar9;
  PageRule *pPVar10;
  Data *pDVar11;
  AnimationRule *pAVar12;
  Data *pDVar13;
  ImportRule *pIVar14;
  Data *pDVar15;
  int iVar16;
  qsizetype qVar17;
  
  if ((b != e) && (b < e)) {
    pEVar1 = (this->super_QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet>).ptr;
    qVar17 = (this->super_QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet>).size;
    do {
      pDVar2 = (b->url).d.d;
      (b->url).d.d = (Data *)0x0;
      pEVar1[qVar17].url.d.d = pDVar2;
      pcVar3 = (b->url).d.ptr;
      (b->url).d.ptr = (char16_t *)0x0;
      pEVar1[qVar17].url.d.ptr = pcVar3;
      qVar4 = (b->url).d.size;
      (b->url).d.size = 0;
      pEVar1[qVar17].url.d.size = qVar4;
      pDVar5 = (b->sheet).styleRules.d.d;
      (b->sheet).styleRules.d.d = (Data *)0x0;
      pEVar1[qVar17].sheet.styleRules.d.d = pDVar5;
      pSVar6 = (b->sheet).styleRules.d.ptr;
      (b->sheet).styleRules.d.ptr = (StyleRule *)0x0;
      pEVar1[qVar17].sheet.styleRules.d.ptr = pSVar6;
      qVar4 = (b->sheet).styleRules.d.size;
      (b->sheet).styleRules.d.size = 0;
      pEVar1[qVar17].sheet.styleRules.d.size = qVar4;
      pDVar7 = (b->sheet).mediaRules.d.d;
      (b->sheet).mediaRules.d.d = (Data *)0x0;
      pEVar1[qVar17].sheet.mediaRules.d.d = pDVar7;
      pMVar8 = (b->sheet).mediaRules.d.ptr;
      (b->sheet).mediaRules.d.ptr = (MediaRule *)0x0;
      pEVar1[qVar17].sheet.mediaRules.d.ptr = pMVar8;
      qVar4 = (b->sheet).mediaRules.d.size;
      (b->sheet).mediaRules.d.size = 0;
      pEVar1[qVar17].sheet.mediaRules.d.size = qVar4;
      pDVar9 = (b->sheet).pageRules.d.d;
      (b->sheet).pageRules.d.d = (Data *)0x0;
      pEVar1[qVar17].sheet.pageRules.d.d = pDVar9;
      pPVar10 = (b->sheet).pageRules.d.ptr;
      (b->sheet).pageRules.d.ptr = (PageRule *)0x0;
      pEVar1[qVar17].sheet.pageRules.d.ptr = pPVar10;
      qVar4 = (b->sheet).pageRules.d.size;
      (b->sheet).pageRules.d.size = 0;
      pEVar1[qVar17].sheet.pageRules.d.size = qVar4;
      pDVar11 = (b->sheet).animationRules.d.d;
      (b->sheet).animationRules.d.d = (Data *)0x0;
      pEVar1[qVar17].sheet.animationRules.d.d = pDVar11;
      pAVar12 = (b->sheet).animationRules.d.ptr;
      (b->sheet).animationRules.d.ptr = (AnimationRule *)0x0;
      pEVar1[qVar17].sheet.animationRules.d.ptr = pAVar12;
      qVar4 = (b->sheet).animationRules.d.size;
      (b->sheet).animationRules.d.size = 0;
      pEVar1[qVar17].sheet.animationRules.d.size = qVar4;
      pDVar13 = (b->sheet).importRules.d.d;
      (b->sheet).importRules.d.d = (Data *)0x0;
      pEVar1[qVar17].sheet.importRules.d.d = pDVar13;
      pIVar14 = (b->sheet).importRules.d.ptr;
      (b->sheet).importRules.d.ptr = (ImportRule *)0x0;
      pEVar1[qVar17].sheet.importRules.d.ptr = pIVar14;
      qVar4 = (b->sheet).importRules.d.size;
      (b->sheet).importRules.d.size = 0;
      pEVar1[qVar17].sheet.importRules.d.size = qVar4;
      iVar16 = (b->sheet).depth;
      pEVar1[qVar17].sheet.origin = (b->sheet).origin;
      pEVar1[qVar17].sheet.depth = iVar16;
      pDVar15 = (b->sheet).nameIndex.d;
      (b->sheet).nameIndex.d = (Data *)0x0;
      pEVar1[qVar17].sheet.nameIndex.d = pDVar15;
      qVar4 = (b->sheet).nameIndex.m_size;
      (b->sheet).nameIndex.m_size = 0;
      pEVar1[qVar17].sheet.nameIndex.m_size = qVar4;
      pDVar15 = (b->sheet).idIndex.d;
      (b->sheet).idIndex.d = (Data *)0x0;
      pEVar1[qVar17].sheet.idIndex.d = pDVar15;
      qVar4 = (b->sheet).idIndex.m_size;
      (b->sheet).idIndex.m_size = 0;
      pEVar1[qVar17].sheet.idIndex.m_size = qVar4;
      b = b + 1;
      qVar17 = (this->super_QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet>).size + 1;
      (this->super_QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet>).size = qVar17;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }